

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ImGuiID IVar4;
  ImRect *r_abs;
  bool bVar5;
  
  pIVar2 = GImGui;
  if (GImGui->DragDropActive == true) {
    this = GImGui->CurrentWindow;
    uVar3 = (this->DC).LastItemStatusFlags;
    if ((((uVar3 & 1) != 0) && (GImGui->HoveredWindow != (ImGuiWindow *)0x0)) &&
       (this->RootWindow == GImGui->HoveredWindow->RootWindow)) {
      uVar3 = uVar3 & 2;
      r_abs = (ImRect *)((this->DC).MenuColumns.Pos + (ulong)uVar3 * 2 + -0x13);
      IVar4 = (this->DC).LastItemId;
      if (IVar4 == 0) {
        IVar4 = ImGuiWindow::GetIDFromRectangle(this,r_abs);
      }
      bVar5 = (pIVar2->DragDropPayload).SourceId != IVar4;
      if (!bVar5) {
        return bVar5;
      }
      if (pIVar2->DragDropWithinTarget == false) {
        IVar1 = *(ImVec2 *)((this->DC).MenuColumns.Pos + (ulong)uVar3 * 2 + -0x11);
        (pIVar2->DragDropTargetRect).Min = r_abs->Min;
        (pIVar2->DragDropTargetRect).Max = IVar1;
        pIVar2->DragDropTargetId = IVar4;
        pIVar2->DragDropWithinTarget = true;
        return true;
      }
      __assert_fail("g.DragDropWithinTarget == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x2420,"bool ImGui::BeginDragDropTarget()");
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;

    const ImRect& display_rect = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? window->DC.LastItemDisplayRect : window->DC.LastItemRect;
    ImGuiID id = window->DC.LastItemId;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}